

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O2

int unz64local_getShort(zlib_filefunc64_32_def *pzlib_filefunc_def,voidpf filestream,uLong *pX)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int i;
  
  i = 0;
  iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
  uVar3 = (ulong)i;
  if (iVar1 == 0) {
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,&i);
  }
  else {
    iVar1 = -1;
  }
  uVar2 = 0;
  if (iVar1 == 0) {
    uVar2 = (long)i << 8 | uVar3;
  }
  *pX = uVar2;
  return iVar1;
}

Assistant:

local int unz64local_getShort(const zlib_filefunc64_32_def* pzlib_filefunc_def,
    voidpf filestream,
    uLong* pX)
{
    uLong x;
    int i = 0;
    int err;

    err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x = (uLong)i;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((uLong)i) << 8;

    if (err == UNZ_OK)
        *pX = x;
    else
        *pX = 0;
    return err;
}